

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> __thiscall
amrex::MLNodeLinOp::makeOwnerMask
          (MLNodeLinOp *this,BoxArray *a_ba,DistributionMapping *dm,Geometry *geom)

{
  Periodicity PVar1;
  MultiFab foo;
  FabFactory<amrex::FArrayBox> local_240;
  MFInfo local_238;
  BoxArray local_208;
  MultiFab local_1a0;
  
  local_1a0.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x100000001;
  local_1a0.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       indexType;
  convert(&local_208,a_ba,(IntVect *)&local_1a0);
  local_238.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.alloc = false;
  local_238._1_7_ = 0;
  local_238.arena._0_4_ = 0;
  local_238.arena._4_4_ = 0;
  local_238.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_240._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074e8d0;
  MultiFab::MultiFab(&local_1a0,&local_208,dm,1,0,&local_238,&local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  PVar1 = Geometry::periodicity(geom);
  local_238._0_8_ = PVar1.period.vect._0_8_;
  local_238.arena._0_4_ = PVar1.period.vect[2];
  MultiFab::OwnerMask((MultiFab *)this,(Periodicity *)&local_1a0);
  MultiFab::~MultiFab(&local_1a0);
  BoxArray::~BoxArray(&local_208);
  return (__uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true>)
         (__uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true>)this;
}

Assistant:

std::unique_ptr<iMultiFab>
MLNodeLinOp::makeOwnerMask (const BoxArray& a_ba, const DistributionMapping& dm,
                            const Geometry& geom)
{
    const BoxArray& ba = amrex::convert(a_ba, IntVect::TheNodeVector());
    MultiFab foo(ba,dm,1,0, MFInfo().SetAlloc(false));
    return foo.OwnerMask(geom.periodicity());
}